

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall BigNum::BigNum(BigNum *this,string *input)

{
  int iVar1;
  char *pcVar2;
  ostream *poVar3;
  ulong uVar4;
  ulong uVar5;
  size_type sVar6;
  int local_38;
  int local_34;
  int local_30;
  int i_2;
  int local_28;
  int i_1;
  int i;
  string *local_18;
  string *input_local;
  BigNum *this_local;
  
  local_18 = input;
  input_local = (string *)this;
  std::vector<int,_std::allocator<int>_>::vector(&this->digits);
  this->sign = true;
  pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)input);
  iVar1 = isdigit((int)*pcVar2);
  if (iVar1 == 0) {
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)input);
    if (*pcVar2 != '-') {
      poVar3 = std::operator<<((ostream *)&std::cout,"Numbers cannot contain character");
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)input);
      poVar3 = std::operator<<(poVar3,*pcVar2);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
  }
  local_28 = 1;
  while( true ) {
    uVar4 = (ulong)local_28;
    uVar5 = std::__cxx11::string::size();
    if (uVar5 <= uVar4) break;
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)input);
    iVar1 = isdigit((int)*pcVar2);
    if (iVar1 == 0) {
      poVar3 = std::operator<<((ostream *)&std::cout,"Numbers cannot contain character");
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)input);
      poVar3 = std::operator<<(poVar3,*pcVar2);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
    local_28 = local_28 + 1;
  }
  pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)input);
  if (*pcVar2 == '-') {
    this->sign = false;
    i_2 = std::__cxx11::string::size();
    while (i_2 = i_2 + -1, 0 < i_2) {
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)input);
      local_30 = *pcVar2 + -0x30;
      std::vector<int,_std::allocator<int>_>::push_back(&this->digits,&local_30);
    }
    sVar6 = std::vector<int,_std::allocator<int>_>::size(&this->digits);
    this->length = (int)sVar6;
  }
  else {
    local_34 = std::__cxx11::string::size();
    while (local_34 = local_34 + -1, -1 < local_34) {
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)input);
      local_38 = *pcVar2 + -0x30;
      std::vector<int,_std::allocator<int>_>::push_back(&this->digits,&local_38);
    }
    sVar6 = std::vector<int,_std::allocator<int>_>::size(&this->digits);
    this->length = (int)sVar6;
  }
  return;
}

Assistant:

BigNum(string input) {
        if (!isdigit(input[0]) && input[0] != '-') {
            cout << "Numbers cannot contain character" << input[0] << endl;
        }
        for (int i = 1; i < input.size(); i++){
            if (!isdigit(input[i]))
                cout << "Numbers cannot contain character" << input[i] << endl;
        }
        if (input[0] == '-') {
            sign = false;
            for (int i = input.size() - 1; i > 0; i--)
                digits.push_back(input[i] - '0');
            length = digits.size();
        } else {
            for (int i = input.size() - 1; i >= 0; i--)
                digits.push_back(input[i] - '0');
            length = digits.size();
        }
    }